

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O0

pboolean p_shm_lock(PShm *shm,PError **error)

{
  PError **error_local;
  PShm *shm_local;
  
  if (shm == (PShm *)0x0) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
    shm_local._4_4_ = 0;
  }
  else {
    shm_local._4_4_ = p_semaphore_acquire(shm->sem,error);
  }
  return shm_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_shm_lock (PShm	*shm,
	    PError	**error)
{
	if (P_UNLIKELY (shm == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	return p_semaphore_acquire (shm->sem, error);
}